

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall
Js::SourceTextModuleRecord::ReleaseParserResourcesForHierarchy(SourceTextModuleRecord *this)

{
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  Parser *this_00;
  int iVar2;
  ulong uVar3;
  
  if (this->parser != (Parser *)0x0) {
    Parser::ReleaseTemporaryGuestArena(this->parser);
  }
  pBVar1 = (this->childrenModuleSet).ptr;
  if ((pBVar1 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)0x0) && (pBVar1->bucketCount != 0)) {
    uVar3 = 0;
    do {
      for (iVar2 = pBVar1->buckets[uVar3]; iVar2 != -1;
          iVar2 = pBVar1->entries[iVar2].
                  super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                  super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                  .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                  next) {
        this_00 = (pBVar1->entries[iVar2].
                   super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                   super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                   .super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                  value)->parser;
        if (this_00 != (Parser *)0x0) {
          Parser::ReleaseTemporaryGuestArena(this_00);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pBVar1->bucketCount);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::ReleaseParserResourcesForHierarchy()
    {
        this->ReleaseParserResources();

        if (this->childrenModuleSet != nullptr)
        {
            this->childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->ReleaseParserResources();
            });
        }
    }